

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O1

void stable_merge_sort_in_place(int **dst,size_t len)

{
  int *piVar1;
  int *_sort_swap_temp;
  long lVar2;
  int **ppiVar3;
  size_t sVar4;
  int **ppiVar5;
  ulong uVar6;
  size_t sVar7;
  ulong uVar8;
  ulong l1;
  ulong uVar9;
  ulong r;
  ulong uVar10;
  int **ppiVar11;
  ulong uVar12;
  bool bVar13;
  
  do {
    r = 2;
    if (0xf < len) {
      lVar2 = 0x3f;
      if (len != 0) {
        for (; len >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      r = 1L << ((byte)((((uint)lVar2 ^ 0x3f) * -2 + 0x7c) / 3) & 0x3f);
    }
    if (len < 2) {
      return;
    }
    if (len < 0x11) {
      stable_bitonic_sort(dst,len);
      return;
    }
    uVar8 = (len / r - 1) * r;
    if (1 < uVar8) {
      uVar12 = 2;
      ppiVar11 = dst + -1;
      ppiVar3 = dst + 2;
      do {
        piVar1 = ppiVar11[2];
        if (*piVar1 < *ppiVar11[1]) {
          ppiVar11[2] = ppiVar11[1];
          ppiVar11[1] = piVar1;
        }
        ppiVar11 = ppiVar11 + 2;
        if ((uVar12 & 2) == 0) {
          uVar6 = len - uVar12;
          l1 = 2;
LAB_00111134:
          if (**(int **)((long)ppiVar11 + ((long)-(l1 << 0x20) >> 0x1d)) <= *ppiVar11[1 - l1])
          goto code_r0x0011115a;
          uVar10 = l1;
          if (uVar6 <= l1) goto LAB_0011120a;
          lVar2 = -l1;
          do {
            piVar1 = ppiVar3[lVar2];
            ppiVar3[lVar2] = dst[len + lVar2];
            dst[len + lVar2] = piVar1;
            lVar2 = lVar2 + 1;
          } while (lVar2 != 0);
          uVar10 = l1 * 2;
          uVar9 = l1;
          if ((uVar10 & uVar12) == 0 && (uVar10 < uVar6 || uVar10 - uVar6 == 0)) {
            do {
              l1 = uVar10;
              stable_merge_sort_in_place_frontmerge
                        (dst + (uVar12 - l1),uVar9,dst + (len - l1) + uVar9,uVar9);
              uVar10 = l1 * 2;
              if (uVar6 < uVar10) break;
              uVar9 = l1;
            } while ((uVar10 & uVar12) == 0);
          }
          stable_merge_sort_in_place_backmerge(dst + (len - 1),l1,ppiVar11 + -l1,l1);
          l1 = uVar10;
LAB_0011120a:
          do {
            uVar9 = l1;
            l1 = uVar9 >> 1;
          } while (uVar6 < uVar9);
          while ((uVar10 & uVar12) == 0) {
            stable_merge_sort_in_place_rmerge
                      (dst + uVar12 + uVar10 * -2,uVar10 * 2,uVar10 & 0x7ffffffffffffffe,uVar9);
            uVar10 = uVar10 * 2;
          }
        }
LAB_00111253:
        uVar12 = uVar12 + 2;
        ppiVar3 = ppiVar3 + 2;
      } while (uVar12 <= uVar8);
    }
    if (r < uVar8) {
      sVar4 = 0;
      uVar12 = r;
      do {
        if (((uVar12 & uVar8) != 0) &&
           (sVar7 = sVar4 + uVar12, bVar13 = sVar4 != 0, sVar4 = sVar7, bVar13)) {
          stable_merge_sort_in_place_rmerge(dst + (uVar8 - sVar7),sVar7,uVar12,r);
        }
        uVar12 = uVar12 * 2;
      } while (uVar12 < uVar8);
    }
    sVar7 = len - uVar8;
    ppiVar11 = dst + uVar8;
    stable_merge_sort_in_place(ppiVar11,sVar7);
    ppiVar3 = ppiVar11;
    sVar4 = sVar7;
    ppiVar5 = dst;
    do {
      piVar1 = *ppiVar5;
      *ppiVar5 = *ppiVar3;
      *ppiVar3 = piVar1;
      ppiVar5 = ppiVar5 + 1;
      ppiVar3 = ppiVar3 + 1;
      sVar4 = sVar4 - 1;
    } while (sVar4 != 0);
    sVar4 = stable_merge_sort_in_place_backmerge
                      (dst + (sVar7 - 1),sVar7,ppiVar11 + -1,uVar8 - sVar7);
    len = sVar7 + sVar4;
  } while( true );
code_r0x0011115a:
  l1 = l1 * 2;
  if ((l1 & uVar12) != 0) goto LAB_00111253;
  goto LAB_00111134;
}

Assistant:

void MERGE_SORT_IN_PLACE(SORT_TYPE *dst, const size_t len) {
  /* don't bother sorting an array of size <= 1 */
  size_t r = rbnd(len);
  size_t lr = (len / r - 1) * r;
  SORT_TYPE *dst1 = dst - 1;
  size_t p, m, q, q1, p0;

  if (len <= 1) {
    return;
  }

  if (len <= SMALL_SORT_BND) {
    SMALL_SORT(dst, len);
    return;
  }

  for (p = 2; p <= lr; p += 2) {
    dst1 += 2;

    if (SORT_CMP(dst1[0], dst1[-1]) < 0) {
      SORT_SWAP(dst1[0], dst1[-1]);
    }

    if (p & 2) {
      continue;
    }

    m = len - p;
    q = 2;

    while ((p & q) == 0) {
      if (SORT_CMP(dst1[1 - q], dst1[-(int)q]) < 0) {
        break;
      }

      q *= 2;
    }

    if (p & q) {
      continue;
    }

    if (q < m) {
      p0 = len - q;
      MERGE_SORT_IN_PLACE_ASWAP(dst + p - q, dst + p0, q);

      for (;;) {
        q1 = 2 * q;

        if ((q1 > m) || (p & q1)) {
          break;
        }

        p0 = len - q1;
        MERGE_SORT_IN_PLACE_FRONTMERGE(dst + (p - q1), q, dst + p0 + q, q);
        q = q1;
      }

      MERGE_SORT_IN_PLACE_BACKMERGE(dst + (len - 1), q, dst1 - q, q);
      q *= 2;
    }

    q1 = q;

    while (q1 > m) {
      q1 /= 2;
    }

    while ((q & p) == 0) {
      q *= 2;
      MERGE_SORT_IN_PLACE_RMERGE(dst + (p - q), q, q / 2, q1);
    }
  }

  q1 = 0;

  for (q = r; q < lr; q *= 2) {
    if ((lr & q) != 0) {
      q1 += q;

      if (q1 != q) {
        MERGE_SORT_IN_PLACE_RMERGE(dst + (lr - q1), q1, q, r);
      }
    }
  }

  m = len - lr;
  MERGE_SORT_IN_PLACE(dst + lr, m);
  MERGE_SORT_IN_PLACE_ASWAP(dst, dst + lr, m);
  m += MERGE_SORT_IN_PLACE_BACKMERGE(dst + (m - 1), m, dst + (lr - 1), lr - m);
  MERGE_SORT_IN_PLACE(dst, m);
}